

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

TCGTemp * tcg_temp_new_internal_mips64(TCGContext_conflict5 *s,TCGType type,_Bool temp_local)

{
  int iVar1;
  unsigned_long uVar2;
  int iVar3;
  int k;
  int idx;
  TCGTemp *ts;
  _Bool temp_local_local;
  TCGType type_local;
  TCGContext_conflict5 *s_local;
  
  iVar3 = 0;
  if (temp_local) {
    iVar3 = 5;
  }
  uVar2 = find_first_bit(s->free_temps[(int)(type + iVar3)].l,0x200);
  iVar1 = (int)uVar2;
  if (iVar1 < 0x200) {
    clear_bit((long)iVar1,s->free_temps[(int)(type + iVar3)].l);
    _k = s->temps + iVar1;
    *(ulong *)_k = *(ulong *)_k & 0xffffff7fffffffff | 0x8000000000;
  }
  else {
    _k = tcg_temp_alloc(s);
    *(ulong *)_k = *(ulong *)_k & 0xffffffffff00ffff | ((ulong)type & 0xff) << 0x10;
    *(ulong *)_k = *(ulong *)_k & 0xffffffff00ffffff | ((ulong)type & 0xff) << 0x18;
    *(ulong *)_k = *(ulong *)_k & 0xffffff7fffffffff | 0x8000000000;
    *(ulong *)_k = *(ulong *)_k & 0xffffffbfffffffff | (ulong)temp_local << 0x26;
  }
  return _k;
}

Assistant:

TCGTemp *tcg_temp_new_internal(TCGContext *s, TCGType type, bool temp_local)
{
    TCGTemp *ts;
    int idx, k;

    k = type + (temp_local ? TCG_TYPE_COUNT : 0);
    idx = find_first_bit(s->free_temps[k].l, TCG_MAX_TEMPS);
    if (idx < TCG_MAX_TEMPS) {
        /* There is already an available temp with the right type.  */
        clear_bit(idx, s->free_temps[k].l);

        ts = &s->temps[idx];
        ts->temp_allocated = 1;
        tcg_debug_assert(ts->base_type == type);
        tcg_debug_assert(ts->temp_local == temp_local);
    } else {
        ts = tcg_temp_alloc(s);
        if (TCG_TARGET_REG_BITS == 32 && type == TCG_TYPE_I64) {
            TCGTemp *ts2 = tcg_temp_alloc(s);

            ts->base_type = type;
            ts->type = TCG_TYPE_I32;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;

            tcg_debug_assert(ts2 == ts + 1);
            ts2->base_type = TCG_TYPE_I64;
            ts2->type = TCG_TYPE_I32;
            ts2->temp_allocated = 1;
            ts2->temp_local = temp_local;
        } else {
            ts->base_type = type;
            ts->type = type;
            ts->temp_allocated = 1;
            ts->temp_local = temp_local;
        }
    }

#if defined(CONFIG_DEBUG_TCG)
    s->temps_in_use++;
#endif
    return ts;
}